

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void * lzma_alloc_zero(size_t size,lzma_allocator *allocator)

{
  void *local_20;
  void *ptr;
  lzma_allocator *allocator_local;
  size_t size_local;
  
  allocator_local = (lzma_allocator *)size;
  if (size == 0) {
    allocator_local = (lzma_allocator *)0x1;
  }
  if ((allocator == (lzma_allocator *)0x0) ||
     (allocator->alloc == (_func_void_ptr_void_ptr_size_t_size_t *)0x0)) {
    local_20 = calloc(1,(size_t)allocator_local);
  }
  else {
    local_20 = (*allocator->alloc)(allocator->opaque,1,(size_t)allocator_local);
    if (local_20 != (void *)0x0) {
      memset(local_20,0,(size_t)allocator_local);
    }
  }
  return local_20;
}

Assistant:

extern void * lzma_attribute((__malloc__)) lzma_attr_alloc_size(1)
lzma_alloc_zero(size_t size, const lzma_allocator *allocator)
{
	// Some calloc() variants return NULL if called with size == 0.
	if (size == 0)
		size = 1;

	void *ptr;

	if (allocator != NULL && allocator->alloc != NULL) {
		ptr = allocator->alloc(allocator->opaque, 1, size);
		if (ptr != NULL)
			memzero(ptr, size);
	} else {
		ptr = calloc(1, size);
	}

	return ptr;
}